

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O3

_Bool Check_Field(FIELDTYPE *typ,FIELD *field,TypeArgument *argp)

{
  _Bool _Var1;
  char *pcVar2;
  
  if (typ != (FIELDTYPE *)0x0) {
    do {
      if ((field->opts & 0x80) != 0) {
        pcVar2 = field->buf;
        if (pcVar2 == (char *)0x0) {
          __assert_fail("bp != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CursesDialog/form/frm_driver.c"
                        ,0xa88,"_Bool Check_Field(FIELDTYPE *, FIELD *, TypeArgument *)");
        }
        for (; *pcVar2 == ' '; pcVar2 = pcVar2 + 1) {
        }
        if (*pcVar2 == '\0') {
          return true;
        }
      }
      if ((typ->status & 1) == 0) {
        if (typ->fcheck == (_func__Bool_FIELD_ptr_void_ptr *)0x0) {
          return true;
        }
        _Var1 = (*typ->fcheck)(field,argp);
        return _Var1;
      }
      if (argp == (TypeArgument *)0x0) {
        __assert_fail("argp != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CursesDialog/form/frm_driver.c"
                      ,0xa91,"_Bool Check_Field(FIELDTYPE *, FIELD *, TypeArgument *)");
      }
      _Var1 = Check_Field(typ->left,field,argp->left);
      if (_Var1) {
        return true;
      }
      typ = typ->right;
      argp = argp->right;
    } while (typ != (typenode *)0x0);
  }
  return true;
}

Assistant:

static bool Check_Field(FIELDTYPE *typ, FIELD *field, TypeArgument *argp)
{
  if (typ)
    {
      if (field->opts & O_NULLOK)
        {
          char *bp = field->buf;
          assert(bp != 0);
          while(is_blank(*bp))
            { bp++; }
          if (*bp == '\0') 
            return TRUE;
        }

      if (typ->status & _LINKED_TYPE)
        {
          assert(argp != 0);
          return( 
                 Check_Field(typ->left ,field,argp->left ) ||
                 Check_Field(typ->right,field,argp->right) );
        }
      else 
        {
          if (typ->fcheck)
            return typ->fcheck(field,(void *)argp);
        }
    }
  return TRUE;
}